

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O2

QRect __thiscall
QStyleSheetStyle::subControlRect
          (QStyleSheetStyle *this,ComplexControl cc,QStyleOptionComplex *opt,SubControl sc,
          QWidget *w)

{
  QRect *pQVar1;
  QSharedDataPointer<QStyleSheetGeometryData> *this_00;
  SubControl SVar2;
  Orientation OVar3;
  Int IVar4;
  long lVar5;
  Int IVar6;
  QStyleSheetStyle *pQVar7;
  bool bVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  Alignment AVar15;
  Alignment AVar16;
  uint uVar17;
  Representation RVar18;
  QStyle *pQVar19;
  QStyleOptionSpinBox *other;
  QStyleOptionTitleBar *pQVar20;
  QStyleOptionComboBox *other_00;
  QStyleOptionGroupBox *other_01;
  qsizetype qVar21;
  QSize QVar22;
  QStyleOptionSlider *pQVar23;
  QSize QVar24;
  QStyleOptionToolButton *other_02;
  QRenderRule *pQVar25;
  QStyleSheetGeometryData *pQVar26;
  QStyleSheetPositionData *ptr;
  long lVar27;
  ulong uVar28;
  Representation RVar29;
  int extraout_EDX;
  int extraout_EDX_00;
  Origin OVar30;
  ulong uVar31;
  Representation RVar32;
  Representation RVar33;
  uint uVar34;
  uint uVar35;
  QFlagsStorage<Qt::AlignmentFlag> QVar36;
  Representation RVar37;
  Representation RVar38;
  undefined8 *puVar39;
  LayoutDirection LVar40;
  Representation RVar41;
  Representation RVar42;
  long lVar43;
  Representation RVar44;
  Representation RVar45;
  QVariant *val;
  QVariant *pQVar46;
  uint range;
  int iVar47;
  long in_FS_OFFSET;
  bool bVar48;
  byte bVar49;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  QByteArrayView layout;
  QRect QVar53;
  QRect QVar54;
  QLatin1StringView sh;
  QRect local_288;
  SubControl sc_local;
  undefined1 local_268 [12];
  Representation RStack_25c;
  undefined1 local_258 [16];
  undefined1 *local_248;
  QPalettePrivate *pQStack_240;
  undefined1 *local_238;
  QObject *pQStack_230;
  undefined1 *local_228;
  undefined1 *puStack_220;
  Data *local_218;
  QRenderRule downRule;
  QRenderRule rule;
  QRenderRule upRule;
  
  pQVar7 = globalStyleSheetStyle;
  bVar49 = 0;
  lVar5 = *(long *)(in_FS_OFFSET + 0x28);
  sc_local = sc;
  if (globalStyleSheetStyle != (QStyleSheetStyle *)this &&
      globalStyleSheetStyle != (QStyleSheetStyle *)0x0) {
    pQVar19 = baseStyle(this);
    QVar53 = (QRect)(**(code **)(*(long *)pQVar19 + 0xd8))(pQVar19,cc,opt,sc,w);
    uVar28 = QVar53._0_8_;
    goto LAB_0035158c;
  }
  if (globalStyleSheetStyle == (QStyleSheetStyle *)0x0) {
    globalStyleSheetStyle = (QStyleSheetStyle *)this;
  }
  memset(&rule,0xaa,0x88);
  renderRule(&rule,this,&w->super_QObject,&opt->super_QStyleOption,0);
  switch(cc) {
  case CC_SpinBox:
    other = qstyleoption_cast<QStyleOptionSpinBox_const*>(&opt->super_QStyleOption);
    if (other == (QStyleOptionSpinBox *)0x0) goto switchD_0034fdd8_caseD_6;
    memset(&upRule,0xaa,0x88);
    renderRule(&upRule,this,&w->super_QObject,&opt->super_QStyleOption,0xb);
    memset(&downRule,0xaa,0x88);
    renderRule(&downRule,this,&w->super_QObject,&opt->super_QStyleOption,0xd);
    bVar48 = true;
    bVar8 = true;
    if (rule.b.d.ptr == (QStyleSheetBoxData *)0x0) {
      if (rule.bd.d.ptr == (QStyleSheetBorderData *)0x0) {
        bVar8 = false;
      }
      else {
        bVar8 = true;
        if (*(long *)((long)rule.bd.d.ptr + 0x68) == 0) {
          bVar8 = *(int *)((long)rule.bd.d.ptr + 0x38) != 0xc;
        }
      }
    }
    if ((downRule.geo.d.ptr != (QStyleSheetGeometryData *)0x0) ||
       (bVar48 = downRule.p.d.ptr != (QStyleSheetPositionData *)0x0,
       (bool)(bVar8 | (upRule.p.d.ptr != (QStyleSheetPositionData *)0x0 ||
                      upRule.geo.d.ptr != (QStyleSheetGeometryData *)0x0) | bVar48))) {
      switch(sc) {
      case SC_ComboBoxFrame:
        if (upRule.p.d.ptr == (QStyleSheetPositionData *)0x0 &&
            upRule.geo.d.ptr == (QStyleSheetGeometryData *)0x0) goto switchD_0034fec7_caseD_3;
        LVar40 = (opt->super_QStyleOption).direction;
        pQVar25 = &upRule;
        iVar47 = 0xb;
LAB_00350c6a:
        QVar53 = positionRect(this,w,&rule,pQVar25,iVar47,&(opt->super_QStyleOption).rect,LVar40);
        break;
      case SC_ComboBoxEditField:
        if (bVar48) {
          LVar40 = (opt->super_QStyleOption).direction;
          pQVar25 = &downRule;
          iVar47 = 0xd;
          goto LAB_00350c6a;
        }
      default:
switchD_0034fec7_caseD_3:
        pQVar19 = baseStyle(this);
        QVar53 = (QRect)(**(code **)(*(long *)pQVar19 + 0xd8))(pQVar19,0,opt,sc,w);
        break;
      case SC_ComboBoxArrow:
        QVar53 = QRenderRule::borderRect(&rule,&(opt->super_QStyleOption).rect);
        break;
      case SC_ComboBoxListBoxPopup:
        QVar54 = QRenderRule::contentsRect(&rule,&(opt->super_QStyleOption).rect);
        QVar36.i = 2;
        if (upRule.p.d.ptr != (QStyleSheetPositionData *)0x0) {
          QVar36.i = *(Int *)((long)upRule.p.d.ptr + 0x18);
        }
        LVar40 = (opt->super_QStyleOption).direction;
        AVar15 = resolveAlignment(LVar40,(Alignment)QVar36.i);
        QVar36.i = 2;
        if (downRule.p.d.ptr != (QStyleSheetPositionData *)0x0) {
          QVar36.i = *(Int *)((long)downRule.p.d.ptr + 0x18);
        }
        AVar16 = resolveAlignment(LVar40,(Alignment)QVar36.i);
        uVar34 = 0;
        uVar9 = 0;
        if (other->buttonSymbols != NoButtons) {
          iVar47 = (**(code **)(*(long *)this + 0xd8))(this,0,opt,1,w);
          uVar34 = (extraout_EDX - iVar47) + 1;
          iVar47 = (**(code **)(*(long *)this + 0xd8))(this,0,opt,2,w);
          uVar9 = (extraout_EDX_00 - iVar47) + 1;
        }
        uVar17 = -((uint)AVar15.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
                         super_QFlagsStorage<Qt::AlignmentFlag>.i & 1) & uVar34;
        uVar35 = -((uint)AVar16.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
                         super_QFlagsStorage<Qt::AlignmentFlag>.i & 1) & uVar9;
        if ((int)uVar35 < (int)uVar17) {
          uVar35 = uVar17;
        }
        uVar34 = ((int)AVar15.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
                       super_QFlagsStorage<Qt::AlignmentFlag>.i << 0x1e) >> 0x1f & uVar34;
        uVar9 = ((int)AVar16.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
                      super_QFlagsStorage<Qt::AlignmentFlag>.i << 0x1e) >> 0x1f & uVar9;
        if ((int)uVar9 < (int)uVar34) {
          uVar9 = uVar34;
        }
        uVar28 = QVar54._8_8_ & 0xffffffff00000000 | (ulong)(QVar54.x2.m_i.m_i - uVar9);
        QVar53.x2.m_i = (int)uVar28;
        QVar53.y2.m_i = (int)(uVar28 >> 0x20);
        QVar53.x1.m_i = (int)QVar54._0_8_;
        QVar53.y1.m_i = (int)((ulong)QVar54._0_8_ >> 0x20);
        uVar28 = (ulong)(uVar35 + QVar54.x1.m_i.m_i);
        goto LAB_00351028;
      }
      uVar28 = QVar53._0_8_;
    }
    else {
      local_218 = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_228 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_220 = &DAT_aaaaaaaaaaaaaaaa;
      local_238 = &DAT_aaaaaaaaaaaaaaaa;
      pQStack_230 = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
      local_248 = &DAT_aaaaaaaaaaaaaaaa;
      pQStack_240 = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
      local_258._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_258._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      stack0xfffffffffffffda0 = (QVariant *)&DAT_aaaaaaaaaaaaaaaa;
      local_268._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QStyleOptionSpinBox::QStyleOptionSpinBox((QStyleOptionSpinBox *)local_268,other);
      local_258 = (undefined1  [16])QRenderRule::borderRect(&rule,&(opt->super_QStyleOption).rect);
      bVar8 = QRenderRule::baseStyleCanDraw(&rule);
      if (bVar8) {
        pQVar19 = baseStyle(this);
        QVar53 = (QRect)(**(code **)(*(long *)pQVar19 + 0xd8))(pQVar19,0,local_268,sc,w);
      }
      else {
        QVar53 = QCommonStyle::subControlRect
                           ((QCommonStyle *)this,CC_SpinBox,(QStyleOptionComplex *)local_268,sc,w);
      }
      uVar28 = QVar53._0_8_;
      QStyleOption::~QStyleOption((QStyleOption *)local_268);
    }
LAB_00351028:
    QRenderRule::~QRenderRule(&downRule);
    QRenderRule::~QRenderRule(&upRule);
    break;
  case CC_ComboBox:
    other_00 = qstyleoption_cast<QStyleOptionComboBox_const*>(&opt->super_QStyleOption);
    if (other_00 == (QStyleOptionComboBox *)0x0) goto switchD_0034fdd8_caseD_6;
    if ((rule.b.d.ptr == (QStyleSheetBoxData *)0x0) &&
       ((rule.bd.d.ptr == (QStyleSheetBorderData *)0x0 ||
        ((*(long *)((long)rule.bd.d.ptr + 0x68) == 0 &&
         (*(int *)((long)rule.bd.d.ptr + 0x38) == 0xc)))))) {
      memset((QStyleOptionComboBox *)&upRule,0xaa,0x90);
      QStyleOptionComboBox::QStyleOptionComboBox((QStyleOptionComboBox *)&upRule,other_00);
      upRule._16_16_ = QRenderRule::borderRect(&rule,&(opt->super_QStyleOption).rect);
      bVar8 = QRenderRule::baseStyleCanDraw(&rule);
      if (bVar8) {
        pQVar19 = baseStyle(this);
        QVar53 = (QRect)(**(code **)(*(long *)pQVar19 + 0xd8))(pQVar19,1,&upRule,sc,w);
      }
      else {
        QVar53 = QCommonStyle::subControlRect
                           ((QCommonStyle *)this,CC_ComboBox,(QStyleOptionComplex *)&upRule,sc,w);
      }
      QStyleOptionComboBox::~QStyleOptionComboBox((QStyleOptionComboBox *)&upRule);
      goto LAB_0035156f;
    }
    if (sc == SC_ComboBoxArrow) {
      memset(&upRule,0xaa,0x88);
      iVar47 = 8;
      renderRule(&upRule,this,&w->super_QObject,&opt->super_QStyleOption,8);
      LVar40 = (opt->super_QStyleOption).direction;
LAB_00350b28:
      QVar53 = positionRect(this,w,&rule,&upRule,iVar47,&(opt->super_QStyleOption).rect,LVar40);
      goto LAB_00350b3f;
    }
    if (sc == SC_ComboBoxEditField) {
      memset(&upRule,0xaa,0x88);
      renderRule(&upRule,this,&w->super_QObject,&opt->super_QStyleOption,8);
      pQVar1 = &(opt->super_QStyleOption).rect;
      QVar53 = QRenderRule::contentsRect(&rule,pQVar1);
      uVar31 = QVar53._8_8_;
      uVar28 = QVar53._0_8_;
      downRule._0_16_ = QVar53;
      QVar54 = positionRect(this,w,&rule,&upRule,8,pQVar1,(opt->super_QStyleOption).direction);
      if ((upRule.p.d.ptr == (QStyleSheetPositionData *)0x0) ||
         ((*(byte *)((long)upRule.p.d.ptr + 0x18) & 1) == 0)) {
        LVar40 = (opt->super_QStyleOption).direction;
        uVar31 = (ulong)(uint)(~QVar54.x2.m_i.m_i + QVar54.x1.m_i.m_i + QVar53.x2.m_i.m_i) |
                 uVar31 & 0xffffffff00000000;
        local_268._8_4_ = (int)uVar31;
        RStack_25c.m_i = (int)(uVar31 >> 0x20);
        local_268._0_4_ = (int)uVar28;
        local_268._4_4_ = (int)(uVar28 >> 0x20);
      }
      else {
        LVar40 = (opt->super_QStyleOption).direction;
        uVar28 = (ulong)((QVar54.x2.m_i.m_i - QVar54.x1.m_i) + QVar53.x1.m_i.m_i + 1) |
                 uVar28 & 0xffffffff00000000;
        local_268._8_4_ = (int)uVar31;
        RStack_25c.m_i = (int)(uVar31 >> 0x20);
        local_268._0_4_ = (int)uVar28;
        local_268._4_4_ = (int)(uVar28 >> 0x20);
      }
      QVar53 = QStyle::visualRect(LVar40,(QRect *)&downRule,(QRect *)local_268);
      goto LAB_00351246;
    }
    if (sc == SC_ComboBoxFrame) goto LAB_003504ee;
    pQVar19 = baseStyle(this);
    lVar43 = *(long *)pQVar19;
    cc = CC_ComboBox;
    goto LAB_00350594;
  case CC_ScrollBar:
    pQVar23 = qstyleoption_cast<QStyleOptionSlider_const*>(&opt->super_QStyleOption);
    if (pQVar23 == (QStyleOptionSlider *)0x0) goto switchD_0034fdd8_caseD_6;
    puVar39 = &DAT_005f5d40;
    pQVar25 = &downRule;
    for (lVar43 = 0x10; lVar43 != 0; lVar43 = lVar43 + -1) {
      *(undefined8 *)pQVar25 = *puVar39;
      puVar39 = puVar39 + (ulong)bVar49 * -2 + 1;
      pQVar25 = (QRenderRule *)((long)pQVar25 + (ulong)bVar49 * -0x10 + 8);
    }
    QStyleOptionSlider::QStyleOptionSlider((QStyleOptionSlider *)&downRule,pQVar23);
    pQVar1 = &(opt->super_QStyleOption).rect;
    downRule._16_16_ = QRenderRule::borderRect(&rule,pQVar1);
    bVar8 = QRenderRule::hasDrawable(&rule);
    if (rule.b.d.ptr == (QStyleSheetBoxData *)0x0 && !bVar8) {
LAB_003512e8:
      bVar8 = QRenderRule::baseStyleCanDraw(&rule);
      if (bVar8) {
        pQVar19 = baseStyle(this);
        QVar53 = (QRect)(**(code **)(*(long *)pQVar19 + 0xd8))(pQVar19,2,&downRule,sc,w);
      }
      else {
        QVar53 = QCommonStyle::subControlRect
                           ((QCommonStyle *)this,CC_ScrollBar,(QStyleOptionComplex *)&downRule,sc,w)
        ;
      }
    }
    else {
      if (rule.b.d.ptr == (QStyleSheetBoxData *)0x0) {
        bVar8 = QRenderRule::baseStyleCanDraw(&rule);
        if (bVar8) {
          pQVar19 = baseStyle(this);
          QVar53 = (QRect)(**(code **)(*(long *)pQVar19 + 0xd8))(pQVar19,2,pQVar23,0x80,w);
        }
        else {
          QVar53 = QCommonStyle::subControlRect
                             ((QCommonStyle *)this,CC_ScrollBar,&pQVar23->super_QStyleOptionComplex,
                              SC_ScrollBarGroove,w);
        }
      }
      else {
        QVar53 = QRenderRule::contentsRect(&rule,pQVar1);
      }
      iVar47 = 0;
      _local_268 = QVar53;
      switch(sc) {
      case SC_ComboBoxFrame:
        iVar47 = 0x18;
        break;
      case SC_ComboBoxEditField:
        iVar47 = 0x19;
        break;
      case SC_ComboBoxEditField|SC_ComboBoxFrame:
      case SC_ComboBoxArrow|SC_ComboBoxFrame:
      case SC_ComboBoxArrow|SC_ComboBoxEditField:
      case SC_ComboBoxArrow|SC_ComboBoxEditField|SC_ComboBoxFrame:
        break;
      case SC_ComboBoxArrow:
      case SC_ComboBoxListBoxPopup:
switchD_00350f85_caseD_4:
        bVar8 = hasStyleRule(this,&w->super_QObject,0x15);
        if (bVar8) {
          memset(&upRule,0xaa,0x88);
          renderRule(&upRule,this,&w->super_QObject,&opt->super_QStyleOption,0x15);
          if (upRule.p.d.ptr == (QStyleSheetPositionData *)0x0) {
            OVar30 = Origin_Content;
          }
          else {
            OVar30 = *(Origin *)((long)upRule.p.d.ptr + 0x14);
          }
          QVar53 = QRenderRule::originRect(&rule,pQVar1,OVar30);
          QRenderRule::~QRenderRule(&upRule);
        }
        RVar42 = QVar53.x1.m_i;
        RVar37 = QVar53.y1.m_i;
        RVar18.m_i = RVar37.m_i;
        if ((int)downRule.bd.d.ptr == 1) {
          RVar18.m_i = RVar42.m_i;
        }
        RVar45 = QVar53.x2.m_i;
        RVar33 = QVar53.y2.m_i;
        RVar38.m_i = RVar33.m_i;
        if ((int)downRule.bd.d.ptr == 1) {
          RVar38.m_i = RVar45.m_i;
        }
        iVar12 = (RVar38.m_i - RVar18.m_i) + 1;
        iVar47 = pQVar23->maximum;
        uVar9 = iVar47 - pQVar23->minimum;
        iVar10 = iVar47;
        iVar11 = iVar12;
        if (uVar9 != 0) {
          iVar47 = pQVar23->pageStep;
          iVar10 = (**(code **)(*(long *)this + 0xe0))(this,10,pQVar23,w);
          iVar11 = (int)(((long)iVar47 * (long)iVar12) / (long)(ulong)(iVar47 + uVar9));
          if (iVar11 < iVar10) {
            iVar11 = iVar10;
          }
          if (0x3fffffff < uVar9) {
            iVar11 = iVar10;
          }
          if (iVar12 <= iVar11) {
            iVar11 = iVar12;
          }
          iVar10 = pQVar23->minimum;
          iVar47 = pQVar23->maximum;
        }
        RVar18.m_i = RVar37.m_i;
        if ((int)downRule.bd.d.ptr == 1) {
          RVar18.m_i = RVar42.m_i;
        }
        iVar47 = QStyle::sliderPositionFromValue
                           (iVar10,iVar47,pQVar23->sliderPosition,iVar12 - iVar11,
                            pQVar23->upsideDown);
        RVar18.m_i = iVar47 + RVar18.m_i;
        if (pQVar23->orientation == Horizontal) {
          RVar38.m_i = iVar11 + RVar18.m_i + -1;
          upRule._4_4_ = RVar37.m_i;
          RVar29.m_i = RVar18.m_i;
          upRule.features = RVar18.m_i;
          upRule._8_4_ = RVar38.m_i;
          upRule._12_4_ = RVar33.m_i;
          RVar18.m_i = RVar33.m_i;
          RVar41.m_i = RVar37.m_i;
        }
        else {
          upRule._12_4_ = iVar11 + RVar18.m_i + -1;
          upRule._4_4_ = RVar18.m_i;
          RVar38.m_i = RVar42.m_i;
          RVar29.m_i = RVar45.m_i;
          upRule.features = RVar42.m_i;
          upRule._8_4_ = RVar45.m_i;
          RVar41.m_i = upRule._12_4_;
        }
        if ((sc == SC_ComboBoxListBoxPopup) ||
           (RVar29.m_i = RVar45.m_i, RVar37.m_i = RVar41.m_i, RVar18.m_i = RVar33.m_i,
           RVar42.m_i = RVar38.m_i, sc == SC_ComboBoxArrow)) {
          upRule.features = RVar42.m_i;
          upRule._4_4_ = RVar37.m_i;
          upRule._8_4_ = RVar29.m_i;
          upRule._12_4_ = RVar18.m_i;
        }
        QVar53 = QStyle::visualRect(downRule._12_4_,(QRect *)local_268,(QRect *)&upRule);
        goto LAB_00351562;
      default:
        if (sc == SC_ScrollBarFirst) {
          iVar47 = 0x1a;
        }
        else if (sc == SC_ScrollBarLast) {
          iVar47 = 0x1b;
        }
        else {
          if (sc == SC_ScrollBarGroove) goto LAB_00351562;
          if (sc == SC_ScrollBarSlider) goto switchD_00350f85_caseD_4;
        }
      }
      bVar8 = hasStyleRule(this,&w->super_QObject,iVar47);
      if (!bVar8) goto LAB_003512e8;
      memset(&upRule,0xaa,0x88);
      renderRule(&upRule,this,&w->super_QObject,&opt->super_QStyleOption,iVar47);
      if (((upRule.p.d.ptr == (QStyleSheetPositionData *)0x0) &&
          (upRule.geo.d.ptr == (QStyleSheetGeometryData *)0x0)) &&
         (upRule.b.d.ptr == (QStyleSheetBoxData *)0x0)) {
        QRenderRule::~QRenderRule(&upRule);
        goto LAB_003512e8;
      }
      local_288 = _local_268;
      if (rule.b.d.ptr != (QStyleSheetBoxData *)0x0) {
        if ((upRule.p.d.ptr == (QStyleSheetPositionData *)0x0) ||
           (OVar30 = *(Origin *)((long)upRule.p.d.ptr + 0x14), OVar30 == Origin_Unknown)) {
          if (iVar47 - 8U < 0x14) {
            OVar30 = *(Origin *)(&DAT_005f60d4 + (ulong)(iVar47 - 8U) * 4);
          }
          else {
            OVar30 = Origin_Margin;
          }
        }
        local_288 = QRenderRule::originRect(&rule,pQVar1,OVar30);
      }
      QVar53 = positionRect(this,w,&upRule,iVar47,&local_288,downRule._12_4_);
      QRenderRule::~QRenderRule(&upRule);
    }
LAB_00351562:
    QStyleOption::~QStyleOption((QStyleOption *)&downRule);
    goto LAB_0035156f;
  case CC_Slider:
    pQVar23 = qstyleoption_cast<QStyleOptionSlider_const*>(&opt->super_QStyleOption);
    if (pQVar23 != (QStyleOptionSlider *)0x0) {
      memset(&upRule,0xaa,0x88);
      renderRule(&upRule,this,&w->super_QObject,&opt->super_QStyleOption,0x31);
      bVar8 = QRenderRule::hasDrawable(&upRule);
      if (bVar8) {
        QSharedDataPointer<QStyleSheetImageData>::reset(&upRule.img,(QStyleSheetImageData *)0x0);
        QVar53 = positionRect(this,w,&rule,&upRule,0x31,&(opt->super_QStyleOption).rect,
                              (opt->super_QStyleOption).direction);
        _local_268 = QVar53;
        if (sc == SC_ComboBoxFrame) goto LAB_00351246;
        if (sc == SC_ComboBoxEditField) {
          OVar3 = pQVar23->orientation;
          local_288 = QRenderRule::contentsRect(&upRule,(QRect *)local_268);
          memset(&downRule,0xaa,0x88);
          renderRule(&downRule,this,&w->super_QObject,&opt->super_QStyleOption,0x32);
          QVar24 = QRenderRule::size(&downRule);
          QSharedDataPointer<QStyleSheetImageData>::reset(&downRule.img,(QStyleSheetImageData *)0x0)
          ;
          QSharedDataPointer<QStyleSheetGeometryData>::reset
                    (&downRule.geo,(QStyleSheetGeometryData *)0x0);
          local_288 = positionRect(this,w,&downRule,0x32,&local_288,
                                   (opt->super_QStyleOption).direction);
          bVar8 = (OVar3 & Horizontal) != 0;
          QVar22 = (QSize)((ulong)QVar24 >> 0x20);
          if (bVar8) {
            QVar22 = QVar24;
          }
          RVar38 = local_288.x2.m_i;
          RVar42 = local_288.x1.m_i;
          RVar18.m_i = local_288.y2.m_i.m_i;
          RVar37.m_i = local_288.y1.m_i.m_i;
          if (!bVar8) {
            RVar18.m_i = RVar38.m_i;
            RVar37.m_i = RVar42.m_i;
            RVar42.m_i = local_288.y1.m_i.m_i;
            RVar38.m_i = local_288.y2.m_i.m_i;
          }
          iVar10 = (RVar18.m_i - RVar37.m_i) + 1;
          RVar44 = QVar22.wd.m_i;
          iVar47 = QStyle::sliderPositionFromValue
                             (pQVar23->minimum,pQVar23->maximum,pQVar23->sliderPosition,
                              (RVar38.m_i - (RVar42.m_i + RVar44.m_i)) + 1,pQVar23->upsideDown);
          if ((OVar3 & Horizontal) == 0) {
            local_288.y1.m_i = iVar47 + local_288.y1.m_i;
            RVar32.m_i = RVar44.m_i;
            RVar44.m_i = iVar10;
          }
          else {
            local_288.x1.m_i = local_288.x1.m_i + iVar47;
            RVar32.m_i = iVar10;
          }
          local_288.x2.m_i = RVar44.m_i + local_288.x1.m_i + -1;
          local_288.y2.m_i = RVar32.m_i + -1 + local_288.y1.m_i;
          QVar53 = QRenderRule::borderRect(&downRule,&local_288);
          goto LAB_00351241;
        }
      }
LAB_00350566:
      QRenderRule::~QRenderRule(&upRule);
    }
  default:
switchD_0034fdd8_caseD_6:
    pQVar19 = baseStyle(this);
    lVar43 = *(long *)pQVar19;
LAB_00350594:
    QVar53 = (QRect)(**(code **)(lVar43 + 0xd8))(pQVar19,cc,opt,sc,w);
LAB_0035059b:
    uVar28 = QVar53._0_8_;
    break;
  case CC_ToolButton:
    other_02 = qstyleoption_cast<QStyleOptionToolButton_const*>(&opt->super_QStyleOption);
    if (other_02 == (QStyleOptionToolButton *)0x0) goto switchD_0034fdd8_caseD_6;
    if ((rule.b.d.ptr != (QStyleSheetBoxData *)0x0) ||
       ((rule.bd.d.ptr != (QStyleSheetBorderData *)0x0 &&
        ((*(long *)((long)rule.bd.d.ptr + 0x68) != 0 ||
         (*(int *)((long)rule.bd.d.ptr + 0x38) != 0xc)))))) {
      if (sc == SC_ComboBoxEditField) {
        memset(&upRule,0xaa,0x88);
        iVar47 = 0x11;
        renderRule(&upRule,this,&w->super_QObject,&opt->super_QStyleOption,0x11);
        LVar40 = (opt->super_QStyleOption).direction;
        goto LAB_00350b28;
      }
      if (sc == SC_ComboBoxFrame) {
LAB_003504ee:
        QVar53 = QRenderRule::borderRect(&rule,&(opt->super_QStyleOption).rect);
        goto LAB_0035059b;
      }
    }
    memset((QStyleOptionToolButton *)&upRule,0xaa,0x98);
    QStyleOptionToolButton::QStyleOptionToolButton((QStyleOptionToolButton *)&upRule,other_02);
    upRule._16_16_ = QRenderRule::borderRect(&rule,&(opt->super_QStyleOption).rect);
    bVar8 = QRenderRule::baseStyleCanDraw(&rule);
    if (bVar8) {
      pQVar19 = baseStyle(this);
      QVar53 = (QRect)(**(code **)(*(long *)pQVar19 + 0xd8))(pQVar19,4,&upRule,sc,w);
    }
    else {
      QVar53 = QCommonStyle::subControlRect
                         ((QCommonStyle *)this,CC_ToolButton,(QStyleOptionComplex *)&upRule,sc,w);
    }
    QStyleOptionToolButton::~QStyleOptionToolButton((QStyleOptionToolButton *)&upRule);
LAB_0035156f:
    uVar28 = QVar53._0_8_;
    break;
  case CC_TitleBar:
    pQVar20 = qstyleoption_cast<QStyleOptionTitleBar_const*>(&opt->super_QStyleOption);
    if (pQVar20 == (QStyleOptionTitleBar *)0x0) goto switchD_0034fdd8_caseD_6;
    memset(&upRule,0xaa,0x88);
    renderRule(&upRule,this,&w->super_QObject,&opt->super_QStyleOption,0x41);
    bVar8 = QRenderRule::hasDrawable(&upRule);
    if (((!bVar8) && (upRule.b.d.ptr == (QStyleSheetBoxData *)0x0)) &&
       (upRule.bd.d.ptr == (QStyleSheetBorderData *)0x0)) goto LAB_00350566;
    downRule._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    titleBarLayout((QStyleSheetStyle *)&downRule,(QWidget *)this,(QStyleOptionTitleBar *)w);
    QVar53 = QHash<QStyle::SubControl,_QRect>::value
                       ((QHash<QStyle::SubControl,_QRect> *)&downRule,&sc_local);
    QHash<QStyle::SubControl,_QRect>::~QHash((QHash<QStyle::SubControl,_QRect> *)&downRule);
LAB_00350b3f:
    QRenderRule::~QRenderRule(&upRule);
LAB_00350b44:
    uVar28 = QVar53._0_8_;
    break;
  case CC_GroupBox:
    other_01 = qstyleoption_cast<QStyleOptionGroupBox_const*>(&opt->super_QStyleOption);
    if (other_01 == (QStyleOptionGroupBox *)0x0) goto switchD_0034fdd8_caseD_6;
    if ((sc != SC_ComboBoxListBoxPopup) && (sc != SC_ComboBoxArrow)) {
      memset(&upRule,0xaa,0x88);
      renderRule(&upRule,this,&w->super_QObject,&opt->super_QStyleOption,0x10);
      memset(&downRule,0xaa,0x88);
      pQVar25 = renderRule(&downRule,this,&w->super_QObject,&opt->super_QStyleOption,0xf);
      auVar50._8_4_ = (int)downRule.geo.d.ptr;
      auVar50._0_8_ = downRule.p.d.ptr;
      auVar50._12_4_ = downRule.geo.d.ptr._4_4_;
      auVar52._12_4_ = downRule.bd.d.ptr._4_4_;
      auVar52._8_4_ = (int)downRule.bd.d.ptr;
      auVar52._0_8_ = downRule.b.d.ptr;
      auVar52 = auVar52 | auVar50;
      auVar51._0_4_ = -(uint)(auVar52._0_4_ == 0);
      auVar51._4_4_ = -(uint)(auVar52._4_4_ == 0);
      auVar51._8_4_ = -(uint)(auVar52._8_4_ == 0);
      auVar51._12_4_ = -(uint)(auVar52._12_4_ == 0);
      iVar47 = movmskps((int)pQVar25,auVar51);
      if ((iVar47 != 0xf) || (bVar8 = QRenderRule::hasContentsSize(&upRule), bVar8)) {
        iVar10 = QFontMetrics::horizontalAdvance
                           ((QString *)&(opt->super_QStyleOption).fontMetrics,(int)other_01 + 0x50);
        iVar11 = QFontMetrics::height();
        iVar12 = (**(code **)(*(long *)this + 0xe0))(this,0x43,opt,w);
        iVar13 = (**(code **)(*(long *)this + 0xe0))(this,0x25,opt,w);
        this_00 = &downRule.geo;
        iVar14 = (**(code **)(*(long *)this + 0xe0))(this,0x26,opt,w);
        uVar9 = (other_01->super_QStyleOptionComplex).subControls.
                super_QFlagsStorageHelper<QStyle::SubControl,_4>.
                super_QFlagsStorage<QStyle::SubControl>.i & 1;
        iVar47 = iVar14;
        if (iVar14 < iVar11) {
          iVar47 = iVar11;
        }
        if (uVar9 == 0) {
          iVar47 = iVar11;
        }
        iVar10 = (-uVar9 & iVar12 + iVar13) + iVar10;
        if (downRule.geo.d.ptr == (QStyleSheetGeometryData *)0x0) {
          pQVar26 = (QStyleSheetGeometryData *)operator_new(0x1c);
          (pQVar26->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
          _q_value.super___atomic_base<int>._M_i = 0;
          pQVar26->minWidth = iVar10;
          pQVar26->minHeight = iVar47;
          pQVar26->width = iVar10;
          pQVar26->height = iVar47;
          pQVar26->maxWidth = -1;
          pQVar26->maxHeight = -1;
          QSharedDataPointer<QStyleSheetGeometryData>::reset(this_00,pQVar26);
        }
        else {
          pQVar26 = QSharedDataPointer<QStyleSheetGeometryData>::operator->(this_00);
          pQVar26->width = iVar10;
          pQVar26 = QSharedDataPointer<QStyleSheetGeometryData>::operator->(this_00);
          pQVar26->height = iVar47;
        }
        if (downRule.p.d.ptr == (QStyleSheetPositionData *)0x0) {
          ptr = (QStyleSheetPositionData *)operator_new(0x24);
          IVar4 = (other_01->textAlignment).super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
                  super_QFlagsStorage<Qt::AlignmentFlag>.i;
          ptr->super_QSharedData = (QAtomicInt)0x0;
          ptr->left = 0;
          ptr->top = 0;
          ptr->bottom = 0;
          ptr->right = 0;
          ptr->origin = Origin_Border;
          (ptr->position).super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
          super_QFlagsStorage<Qt::AlignmentFlag>.i = IVar4;
          ptr->mode = PositionMode_Static;
          ptr->textAlignment = (QFlagsStorageHelper<Qt::AlignmentFlag,_4>)0x0;
          QSharedDataPointer<QStyleSheetPositionData>::reset(&downRule.p,ptr);
        }
        _local_268 = positionRect(this,w,&rule,&downRule,0xf,&(opt->super_QStyleOption).rect,
                                  (opt->super_QStyleOption).direction);
        IVar6 = (other_01->super_QStyleOptionComplex).subControls.
                super_QFlagsStorageHelper<QStyle::SubControl,_4>.
                super_QFlagsStorage<QStyle::SubControl>.i;
        QVar53 = QRenderRule::contentsRect(&downRule,(QRect *)local_268);
        lVar43 = QVar53._0_8_;
        if ((IVar6 & 1) != 0) {
          local_268._0_4_ = (int)lVar43;
          local_268._4_4_ = (int)((ulong)lVar43 >> 0x20);
          lVar27 = (long)QVar53._8_8_ >> 0x20;
          if (sc == SC_ComboBoxEditField) {
            local_268._0_4_ = iVar12 + iVar13 + QVar53.x1.m_i.m_i;
            iVar47 = iVar47 / -2 + (int)((lVar27 + (lVar43 >> 0x20)) / 2);
            pQVar46 = QVar53._8_8_;
          }
          else {
            iVar47 = iVar14 / -2 + (int)((lVar27 + (lVar43 >> 0x20)) / 2);
            local_268._8_4_ = iVar13 + QVar53.x1.m_i.m_i + -1;
            local_268._0_4_ = (int)lVar43;
            local_268._4_4_ = (int)((ulong)lVar43 >> 0x20);
            RStack_25c.m_i = iVar14 + iVar47 + -1;
            pQVar46 = stack0xfffffffffffffda0;
          }
          local_268._4_4_ = iVar47;
          QVar53._8_8_ = pQVar46;
          QVar53.x1.m_i = local_268._0_4_;
          QVar53.y1.m_i = iVar47;
        }
      }
      else {
        memset((QStyleOptionGroupBox *)local_268,0xaa,0x88);
        QStyleOptionGroupBox::QStyleOptionGroupBox((QStyleOptionGroupBox *)local_268,other_01);
        local_258 = (undefined1  [16])QRenderRule::borderRect(&rule,&(opt->super_QStyleOption).rect)
        ;
        pQVar19 = baseStyle(this);
        QVar53 = (QRect)(**(code **)(*(long *)pQVar19 + 0xd8))
                                  (pQVar19,7,(QStyleOptionGroupBox *)local_268,sc,w);
        QStyleOptionGroupBox::~QStyleOptionGroupBox((QStyleOptionGroupBox *)local_268);
      }
LAB_00351241:
      QRenderRule::~QRenderRule(&downRule);
LAB_00351246:
      QRenderRule::~QRenderRule(&upRule);
      goto LAB_0035156f;
    }
    if ((rule.b.d.ptr == (QStyleSheetBoxData *)0x0) &&
       ((rule.bd.d.ptr == (QStyleSheetBorderData *)0x0 ||
        ((*(long *)((long)rule.bd.d.ptr + 0x68) == 0 &&
         (*(int *)((long)rule.bd.d.ptr + 0x38) == 0xc)))))) {
      memset(&upRule,0xaa,0x88);
      QStyleOptionGroupBox::QStyleOptionGroupBox((QStyleOptionGroupBox *)&upRule,other_01);
      upRule._16_16_ = QRenderRule::borderRect(&rule,&(opt->super_QStyleOption).rect);
      pQVar19 = baseStyle(this);
      QVar53 = (QRect)(**(code **)(*(long *)pQVar19 + 0xd8))(pQVar19,7,&upRule,sc,w);
      QStyleOptionGroupBox::~QStyleOptionGroupBox((QStyleOptionGroupBox *)&upRule);
      goto LAB_00350b44;
    }
    if (sc == SC_ComboBoxListBoxPopup) goto LAB_003504ee;
    QVar53 = QRenderRule::contentsRect(&rule,&(opt->super_QStyleOption).rect);
    goto LAB_0035059b;
  case CC_MdiControls:
    bVar8 = hasStyleRule(this,&w->super_QObject,0x3e);
    if (!bVar8) {
      bVar8 = hasStyleRule(this,&w->super_QObject,0x40);
      if (!bVar8) {
        bVar8 = hasStyleRule(this,&w->super_QObject,0x3f);
        if (!bVar8) goto switchD_0034fdd8_caseD_6;
      }
    }
    local_258._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    stack0xfffffffffffffda0 = (QVariant *)&DAT_aaaaaaaaaaaaaaaa;
    local_268._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    sh.m_data = "button-layout";
    sh.m_size = 0xd;
    QRenderRule::styleHint((QVariant *)&upRule,&rule,sh);
    ::QVariant::toList();
    ::QVariant::~QVariant((QVariant *)&upRule);
    if (local_258._0_8_ == 0) {
      qVar21 = QByteArrayView::lengthHelperCharArray("mNX",4);
      layout.m_data = "mNX";
      layout.m_size = qVar21;
      subControlLayout((QList<QVariant> *)&upRule,layout);
      QArrayDataPointer<QVariant>::operator=
                ((QArrayDataPointer<QVariant> *)local_268,(QArrayDataPointer<QVariant> *)&upRule);
      QArrayDataPointer<QVariant>::~QArrayDataPointer((QArrayDataPointer<QVariant> *)&upRule);
    }
    memset(&upRule,0xaa,0x88);
    QRenderRule::QRenderRule(&upRule);
    iVar47 = 0;
    QVar22.wd.m_i = 0;
    QVar22.ht.m_i = 0;
    pQVar46 = stack0xfffffffffffffda0;
    for (lVar43 = local_258._0_8_ << 5; RVar44 = QVar22.wd.m_i, lVar43 != 0; lVar43 = lVar43 + -0x20
        ) {
      uVar9 = ::QVariant::toInt((bool *)pQVar46);
      if ((0xfffffffc < uVar9 - 0x41) &&
         (SVar2 = knownPseudoElements[uVar9].subControl,
         ((opt->subControls).super_QFlagsStorageHelper<QStyle::SubControl,_4>.
          super_QFlagsStorage<QStyle::SubControl>.i & SVar2) != SC_None)) {
        renderRule(&downRule,this,&w->super_QObject,&opt->super_QStyleOption,uVar9);
        QRenderRule::operator=(&upRule,&downRule);
        QRenderRule::~QRenderRule(&downRule);
        QVar22 = QRenderRule::size(&upRule);
        RVar44 = QVar22.wd.m_i;
        if (SVar2 == sc) break;
        iVar47 = iVar47 + RVar44.m_i;
      }
      pQVar46 = pQVar46 + 1;
    }
    downRule._4_4_ = (opt->super_QStyleOption).rect.y1.m_i;
    downRule.features = iVar47;
    downRule._8_4_ = iVar47 + -1 + RVar44.m_i;
    downRule._12_4_ = (opt->super_QStyleOption).rect.y2.m_i;
    QVar53 = QRenderRule::borderRect(&upRule,(QRect *)&downRule);
    uVar28 = QVar53._0_8_;
    QRenderRule::~QRenderRule(&upRule);
    QArrayDataPointer<QVariant>::~QArrayDataPointer((QArrayDataPointer<QVariant> *)local_268);
  }
  QRenderRule::~QRenderRule(&rule);
  if (pQVar7 == (QStyleSheetStyle *)0x0) {
    globalStyleSheetStyle = (QStyleSheetStyle *)0x0;
  }
LAB_0035158c:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar5) {
    QVar54._0_8_ = uVar28 & 0xffffffff | QVar53._0_8_ & 0xffffffff00000000;
    QVar54.x2.m_i = (int)QVar53._8_8_;
    QVar54.y2.m_i = (int)((ulong)QVar53._8_8_ >> 0x20);
    return QVar54;
  }
  __stack_chk_fail();
}

Assistant:

QRect QStyleSheetStyle::subControlRect(ComplexControl cc, const QStyleOptionComplex *opt, SubControl sc,
                              const QWidget *w) const
{
    RECURSION_GUARD(return baseStyle()->subControlRect(cc, opt, sc, w))

    QRenderRule rule = renderRule(w, opt);
    switch (cc) {
    case CC_ComboBox:
        if (const QStyleOptionComboBox *cb = qstyleoption_cast<const QStyleOptionComboBox *>(opt)) {
            if (rule.hasBox() || !rule.hasNativeBorder()) {
                switch (sc) {
                case SC_ComboBoxFrame: return rule.borderRect(opt->rect);
                case SC_ComboBoxEditField:
                    {
                        QRenderRule subRule = renderRule(w, opt, PseudoElement_ComboBoxDropDown);
                        QRect r = rule.contentsRect(opt->rect);
                        QRect r2 = positionRect(w, rule, subRule, PseudoElement_ComboBoxDropDown,
                                opt->rect, opt->direction);
                        if (subRule.hasPosition() && subRule.position()->position & Qt::AlignLeft) {
                            return visualRect(opt->direction, r, r.adjusted(r2.width(),0,0,0));
                        } else {
                            return visualRect(opt->direction, r, r.adjusted(0,0,-r2.width(),0));
                        }
                    }
                case SC_ComboBoxArrow: {
                    QRenderRule subRule = renderRule(w, opt, PseudoElement_ComboBoxDropDown);
                    return positionRect(w, rule, subRule, PseudoElement_ComboBoxDropDown, opt->rect, opt->direction);
                                                                           }
                case SC_ComboBoxListBoxPopup:
                default:
                    return baseStyle()->subControlRect(cc, opt, sc, w);
                }
            }

            QStyleOptionComboBox comboBox(*cb);
            comboBox.rect = rule.borderRect(opt->rect);
            return rule.baseStyleCanDraw() ? baseStyle()->subControlRect(cc, &comboBox, sc, w)
                                           : QWindowsStyle::subControlRect(cc, &comboBox, sc, w);
        }
        break;

#if QT_CONFIG(spinbox)
    case CC_SpinBox:
        if (const QStyleOptionSpinBox *spin = qstyleoption_cast<const QStyleOptionSpinBox *>(opt)) {
            QRenderRule upRule = renderRule(w, opt, PseudoElement_SpinBoxUpButton);
            QRenderRule downRule = renderRule(w, opt, PseudoElement_SpinBoxDownButton);
            bool ruleMatch = rule.hasBox() || !rule.hasNativeBorder();
            bool upRuleMatch = upRule.hasGeometry() || upRule.hasPosition();
            bool downRuleMatch = downRule.hasGeometry() || downRule.hasPosition();
            if (ruleMatch || upRuleMatch || downRuleMatch) {
                switch (sc) {
                case SC_SpinBoxFrame:
                    return rule.borderRect(opt->rect);
                case SC_SpinBoxEditField:
                    {
                        QRect r = rule.contentsRect(opt->rect);
                        // Use the widest button on each side to determine edit field size.
                        Qt::Alignment upAlign, downAlign;

                        upAlign = upRule.hasPosition() ? upRule.position()->position
                                : Qt::Alignment(Qt::AlignRight);
                        upAlign = resolveAlignment(opt->direction, upAlign);

                        downAlign = downRule.hasPosition() ? downRule.position()->position
                                : Qt::Alignment(Qt::AlignRight);
                        downAlign = resolveAlignment(opt->direction, downAlign);

                        const bool hasButtons = (spin->buttonSymbols != QAbstractSpinBox::NoButtons);
                        const int upSize = hasButtons
                                ? subControlRect(CC_SpinBox, opt, SC_SpinBoxUp, w).width() : 0;
                        const int downSize = hasButtons
                                ? subControlRect(CC_SpinBox, opt, SC_SpinBoxDown, w).width() : 0;

                        int widestL = qMax((upAlign & Qt::AlignLeft) ? upSize : 0,
                                (downAlign & Qt::AlignLeft) ? downSize : 0);
                        int widestR = qMax((upAlign & Qt::AlignRight) ? upSize : 0,
                                (downAlign & Qt::AlignRight) ? downSize : 0);
                        r.setRight(r.right() - widestR);
                        r.setLeft(r.left() + widestL);
                        return r;
                    }
                case SC_SpinBoxDown:
                    if (downRuleMatch)
                        return positionRect(w, rule, downRule, PseudoElement_SpinBoxDownButton,
                                opt->rect, opt->direction);
                    break;
                case SC_SpinBoxUp:
                    if (upRuleMatch)
                        return positionRect(w, rule, upRule, PseudoElement_SpinBoxUpButton,
                                opt->rect, opt->direction);
                    break;
                default:
                    break;
                }

                return baseStyle()->subControlRect(cc, opt, sc, w);
            }

            QStyleOptionSpinBox spinBox(*spin);
            spinBox.rect = rule.borderRect(opt->rect);
            return rule.baseStyleCanDraw() ? baseStyle()->subControlRect(cc, &spinBox, sc, w)
                                           : QWindowsStyle::subControlRect(cc, &spinBox, sc, w);
        }
        break;
#endif // QT_CONFIG(spinbox)

    case CC_GroupBox:
        if (const QStyleOptionGroupBox *gb = qstyleoption_cast<const QStyleOptionGroupBox *>(opt)) {
            switch (sc) {
            case SC_GroupBoxFrame:
            case SC_GroupBoxContents: {
                if (rule.hasBox() || !rule.hasNativeBorder()) {
                    return sc == SC_GroupBoxFrame ? rule.borderRect(opt->rect)
                                                  : rule.contentsRect(opt->rect);
                }
                QStyleOptionGroupBox groupBox(*gb);
                groupBox.rect = rule.borderRect(opt->rect);
                return baseStyle()->subControlRect(cc, &groupBox, sc, w);
            }
            default:
            case SC_GroupBoxLabel:
            case SC_GroupBoxCheckBox: {
                QRenderRule indRule = renderRule(w, opt, PseudoElement_GroupBoxIndicator);
                QRenderRule labelRule = renderRule(w, opt, PseudoElement_GroupBoxTitle);
                if (!labelRule.hasPosition() && !labelRule.hasGeometry() && !labelRule.hasBox()
                    && !labelRule.hasBorder() && !indRule.hasContentsSize()) {
                    QStyleOptionGroupBox groupBox(*gb);
                    groupBox.rect = rule.borderRect(opt->rect);
                    return baseStyle()->subControlRect(cc, &groupBox, sc, w);
                }
                int tw = opt->fontMetrics.horizontalAdvance(gb->text);
                int th = opt->fontMetrics.height();
                int spacing = pixelMetric(QStyle::PM_CheckBoxLabelSpacing, opt, w);
                int iw = pixelMetric(QStyle::PM_IndicatorWidth, opt, w);
                int ih = pixelMetric(QStyle::PM_IndicatorHeight, opt, w);

                if (gb->subControls & QStyle::SC_GroupBoxCheckBox) {
                    tw = tw + iw + spacing;
                    th = qMax(th, ih);
                }
                if (!labelRule.hasGeometry()) {
                    labelRule.geo = new QStyleSheetGeometryData(tw, th, tw, th, -1, -1);
                } else {
                    labelRule.geo->width = tw;
                    labelRule.geo->height = th;
                }
                if (!labelRule.hasPosition()) {
                    labelRule.p = new QStyleSheetPositionData(0, 0, 0, 0, defaultOrigin(PseudoElement_GroupBoxTitle),
                                                              gb->textAlignment, PositionMode_Static);
                }
                QRect r = positionRect(w, rule, labelRule, PseudoElement_GroupBoxTitle,
                                      opt->rect, opt->direction);
                if (gb->subControls & SC_GroupBoxCheckBox) {
                    r = labelRule.contentsRect(r);
                    if (sc == SC_GroupBoxLabel) {
                        r.setLeft(r.left() + iw + spacing);
                        r.setTop(r.center().y() - th/2);
                    } else {
                        r = QRect(r.left(), r.center().y() - ih/2, iw, ih);
                    }
                    return r;
                } else {
                    return labelRule.contentsRect(r);
                }
            }
            } // switch
        }
        break;

    case CC_ToolButton:
        if (const QStyleOptionToolButton *tb = qstyleoption_cast<const QStyleOptionToolButton *>(opt)) {
            if (rule.hasBox() || !rule.hasNativeBorder()) {
                switch (sc) {
                case SC_ToolButton: return rule.borderRect(opt->rect);
                case SC_ToolButtonMenu: {
                    QRenderRule subRule = renderRule(w, opt, PseudoElement_ToolButtonMenu);
                    return positionRect(w, rule, subRule, PseudoElement_ToolButtonMenu, opt->rect, opt->direction);
                                                                            }
                default:
                    break;
                }
            }

            QStyleOptionToolButton tool(*tb);
            tool.rect = rule.borderRect(opt->rect);
            return rule.baseStyleCanDraw() ? baseStyle()->subControlRect(cc, &tool, sc, w)
                                           : QWindowsStyle::subControlRect(cc, &tool, sc, w);
            }
            break;

#if QT_CONFIG(scrollbar)
    case CC_ScrollBar:
        if (const QStyleOptionSlider *sb = qstyleoption_cast<const QStyleOptionSlider *>(opt)) {
            QStyleOptionSlider styleOptionSlider(*sb);
            styleOptionSlider.rect = rule.borderRect(opt->rect);
            if (rule.hasDrawable() || rule.hasBox()) {
                QRect grooveRect;
                if (!rule.hasBox()) {
                    grooveRect = rule.baseStyleCanDraw() ? baseStyle()->subControlRect(cc, sb, SC_ScrollBarGroove, w)
                                 : QWindowsStyle::subControlRect(cc, sb, SC_ScrollBarGroove, w);
                } else {
                    grooveRect = rule.contentsRect(opt->rect);
                }

                PseudoElement pe = PseudoElement_None;

                switch (sc) {
                case SC_ScrollBarGroove:
                    return grooveRect;
                case SC_ScrollBarAddPage:
                case SC_ScrollBarSubPage:
                case SC_ScrollBarSlider: {
                    QRect contentRect = grooveRect;
                    if (hasStyleRule(w, PseudoElement_ScrollBarSlider)) {
                        QRenderRule sliderRule = renderRule(w, opt, PseudoElement_ScrollBarSlider);
                        Origin origin = sliderRule.hasPosition() ? sliderRule.position()->origin : defaultOrigin(PseudoElement_ScrollBarSlider);
                        contentRect = rule.originRect(opt->rect, origin);
                    }
                    int maxlen = (styleOptionSlider.orientation == Qt::Horizontal) ? contentRect.width() : contentRect.height();
                    int sliderlen;
                    if (sb->maximum != sb->minimum) {
                        uint range = sb->maximum - sb->minimum;
                        sliderlen = (qint64(sb->pageStep) * maxlen) / (range + sb->pageStep);

                        int slidermin = pixelMetric(PM_ScrollBarSliderMin, sb, w);
                        if (sliderlen < slidermin || range > INT_MAX / 2)
                            sliderlen = slidermin;
                        if (sliderlen > maxlen)
                            sliderlen = maxlen;
                    } else {
                        sliderlen = maxlen;
                    }
                    int sliderstart = (styleOptionSlider.orientation == Qt::Horizontal ? contentRect.left() : contentRect.top())
                        + sliderPositionFromValue(sb->minimum, sb->maximum, sb->sliderPosition,
                                                  maxlen - sliderlen, sb->upsideDown);

                    QRect sr = (sb->orientation == Qt::Horizontal)
                               ? QRect(sliderstart, contentRect.top(), sliderlen, contentRect.height())
                               : QRect(contentRect.left(), sliderstart, contentRect.width(), sliderlen);
                    if (sc == SC_ScrollBarSubPage)
                        sr = QRect(contentRect.topLeft(), sb->orientation == Qt::Horizontal ? sr.bottomLeft() : sr.topRight());
                    else if (sc == SC_ScrollBarAddPage)
                        sr = QRect(sb->orientation == Qt::Horizontal ? sr.topRight() : sr.bottomLeft(), contentRect.bottomRight());
                    return visualRect(styleOptionSlider.direction, grooveRect, sr);
                }
                case SC_ScrollBarAddLine: pe = PseudoElement_ScrollBarAddLine; break;
                case SC_ScrollBarSubLine: pe = PseudoElement_ScrollBarSubLine; break;
                case SC_ScrollBarFirst: pe = PseudoElement_ScrollBarFirst;  break;
                case SC_ScrollBarLast: pe = PseudoElement_ScrollBarLast; break;
                default: break;
                }
                if (hasStyleRule(w,pe)) {
                    QRenderRule subRule = renderRule(w, opt, pe);
                    if (subRule.hasPosition() || subRule.hasGeometry() || subRule.hasBox()) {
                        const QStyleSheetPositionData *pos = subRule.position();
                        QRect originRect = grooveRect;
                        if (rule.hasBox()) {
                            Origin origin = (pos && pos->origin != Origin_Unknown) ? pos->origin : defaultOrigin(pe);
                            originRect = rule.originRect(opt->rect, origin);
                        }
                        return positionRect(w, subRule, pe, originRect, styleOptionSlider.direction);
                    }
                }
            }
            return rule.baseStyleCanDraw() ? baseStyle()->subControlRect(cc, &styleOptionSlider, sc, w)
                                           : QWindowsStyle::subControlRect(cc, &styleOptionSlider, sc, w);
        }
        break;
#endif // QT_CONFIG(scrollbar)

#if QT_CONFIG(slider)
    case CC_Slider:
        if (const QStyleOptionSlider *slider = qstyleoption_cast<const QStyleOptionSlider *>(opt)) {
            QRenderRule subRule = renderRule(w, opt, PseudoElement_SliderGroove);
            if (!subRule.hasDrawable())
                break;
            subRule.img = nullptr;
            QRect gr = positionRect(w, rule, subRule, PseudoElement_SliderGroove, opt->rect, opt->direction);
            switch (sc) {
            case SC_SliderGroove:
                return gr;
            case SC_SliderHandle: {
                bool horizontal = slider->orientation & Qt::Horizontal;
                QRect cr = subRule.contentsRect(gr);
                QRenderRule subRule2 = renderRule(w, opt, PseudoElement_SliderHandle);
                int len = horizontal ? subRule2.size().width() : subRule2.size().height();
                subRule2.img = nullptr;
                subRule2.geo = nullptr;
                cr = positionRect(w, subRule2, PseudoElement_SliderHandle, cr, opt->direction);
                int thickness = horizontal ? cr.height() : cr.width();
                int sliderPos = sliderPositionFromValue(slider->minimum, slider->maximum, slider->sliderPosition,
                                                        (horizontal ? cr.width() : cr.height()) - len, slider->upsideDown);
                cr = horizontal ? QRect(cr.x() + sliderPos, cr.y(), len, thickness)
                                  : QRect(cr.x(), cr.y() + sliderPos, thickness, len);
                return subRule2.borderRect(cr);
                break; }
            case SC_SliderTickmarks:
                // TODO...
            default:
                break;
            }
        }
        break;
#endif // QT_CONFIG(slider)

    case CC_MdiControls:
        if (hasStyleRule(w, PseudoElement_MdiCloseButton)
            || hasStyleRule(w, PseudoElement_MdiNormalButton)
            || hasStyleRule(w, PseudoElement_MdiMinButton)) {
            QList<QVariant> layout = rule.styleHint("button-layout"_L1).toList();
            if (layout.isEmpty())
                layout = subControlLayout("mNX");

            int x = 0, width = 0;
            QRenderRule subRule;
            for (const QVariant &val : std::as_const(layout)) {
                int layoutButton = val.toInt();
                if (layoutButton < PseudoElement_MdiCloseButton
                    || layoutButton > PseudoElement_MdiNormalButton)
                    continue;
                QStyle::SubControl control = knownPseudoElements[layoutButton].subControl;
                if (!(opt->subControls & control))
                    continue;
                subRule = renderRule(w, opt, layoutButton);
                width = subRule.size().width();
                if (sc == control)
                    break;
                x += width;
            }

            return subRule.borderRect(QRect(x, opt->rect.top(), width, opt->rect.height()));
        }
        break;

    case CC_TitleBar:
        if (const QStyleOptionTitleBar *tb = qstyleoption_cast<const QStyleOptionTitleBar *>(opt)) {
            QRenderRule subRule = renderRule(w, opt, PseudoElement_TitleBar);
            if (!subRule.hasDrawable() && !subRule.hasBox() && !subRule.hasBorder())
                break;
            QHash<QStyle::SubControl, QRect> layoutRects = titleBarLayout(w, tb);
            return layoutRects.value(sc);
        }
        break;

    default:
        break;
    }

    return baseStyle()->subControlRect(cc, opt, sc, w);
}